

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctaes.c
# Opt level: O0

void InvShiftRows(AES_state *s)

{
  ushort uVar1;
  long lVar2;
  long in_RDI;
  long in_FS_OFFSET;
  uint16_t v;
  int i;
  undefined4 local_14;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  for (local_14 = 0; local_14 < 8; local_14 = local_14 + 1) {
    uVar1 = *(ushort *)(in_RDI + (long)local_14 * 2);
    *(ushort *)(in_RDI + (long)local_14 * 2) =
         uVar1 & 0xf | (uVar1 & 0x70) << 1 | (ushort)((int)(uVar1 & 0x80) >> 3) |
         (uVar1 & 0x300) << 2 | (ushort)((int)(uVar1 & 0xc00) >> 2) | (uVar1 & 0x1000) << 3 |
         (ushort)((int)(uVar1 & 0xe000) >> 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void InvShiftRows(AES_state* s) {
    int i;
    for (i = 0; i < 8; i++) {
        uint16_t v = s->slice[i];
        s->slice[i] =
            (v & BIT_RANGE(0, 4)) |
            BIT_RANGE_LEFT(v, 4, 7, 1) | BIT_RANGE_RIGHT(v, 7, 8, 3) |
            BIT_RANGE_LEFT(v, 8, 10, 2) | BIT_RANGE_RIGHT(v, 10, 12, 2) |
            BIT_RANGE_LEFT(v, 12, 13, 3) | BIT_RANGE_RIGHT(v, 13, 16, 1);
    }
}